

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

Offset<reflection::EnumVal> __thiscall
flatbuffers::EnumVal::Serialize(EnumVal *this,FlatBufferBuilder *builder,Parser *parser)

{
  bool bVar1;
  Offset<flatbuffers::String> name;
  Offset<reflection::EnumVal> OVar2;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> local_38;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_> local_34;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_> docs__;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_> attr__;
  Offset<reflection::Type> type__;
  Offset<flatbuffers::String> name__;
  Parser *parser_local;
  FlatBufferBuilder *builder_local;
  EnumVal *this_local;
  
  name = FlatBufferBuilderImpl<false>::CreateString<flatbuffers::Offset>(builder,&this->name);
  docs__.o = (offset_type)Type::Serialize(&this->union_type,builder);
  local_34 = SerializeAttributes(this,builder,parser);
  if (((parser->opts).binary_schema_comments & 1U) != 0) {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->doc_comment);
    if (!bVar1) {
      local_38 = FlatBufferBuilderImpl<false>::
                 CreateVectorOfStrings<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                           (builder,&this->doc_comment);
      goto LAB_00135dff;
    }
  }
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>::Offset
            (&local_38,0);
LAB_00135dff:
  OVar2 = reflection::CreateEnumVal(builder,name,this->value,docs__.o,local_38,local_34);
  return (Offset<reflection::EnumVal>)OVar2.o;
}

Assistant:

Offset<reflection::EnumVal> EnumVal::Serialize(FlatBufferBuilder *builder,
                                               const Parser &parser) const {
  const auto name__ = builder->CreateString(name);
  const auto type__ = union_type.Serialize(builder);
  const auto attr__ = SerializeAttributes(builder, parser);
  const auto docs__ = parser.opts.binary_schema_comments && !doc_comment.empty()
                          ? builder->CreateVectorOfStrings(doc_comment)
                          : 0;
  return reflection::CreateEnumVal(*builder, name__, value, type__, docs__,
                                   attr__);
}